

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::definition_object::definition_object
          (definition_object *this,not_null<context_*> ctxt,
          not_null<definition::container_*> definitions,not_null<const_string_mapping_*> names,
          fragment_index_pointer *fragments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__definition_object_0015ba70;
  (this->definitions_).ptr_ = definitions.ptr_;
  (this->names_).ptr_ = names.ptr_;
  (this->fragments_).
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (fragments->
            super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var1 = (fragments->
           super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->fragments_).
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit rule (not_null<context *> const context) noexcept
                        : context_{context} {}